

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextProfiler.cpp
# Opt level: O3

ULONG __thiscall Js::ScriptContextProfiler::Release(ScriptContextProfiler *this)

{
  Recycler *this_00;
  ULONG UVar1;
  
  UVar1 = this->refcount - 1;
  this->refcount = UVar1;
  if (UVar1 == 0) {
    this_00 = this->recycler;
    if ((this_00 != (Recycler *)0x0) && (this->profiler == this_00->profiler)) {
      Memory::Recycler::SetProfiler(this_00,(Profiler *)0x0,(Profiler *)0x0);
    }
    ~ScriptContextProfiler(this);
    Memory::NoCheckHeapAllocator::Free
              ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,this,0x40);
  }
  return UVar1;
}

Assistant:

ULONG
    ScriptContextProfiler::Release()
    {
        ULONG count = --refcount;
        if (count == 0)
        {
            if (recycler != nullptr && this->profiler == recycler->GetProfiler())
            {
                recycler->SetProfiler(nullptr, nullptr);
            }
            NoCheckHeapDelete(this);
        }
        return count;
    }